

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O0

void __thiscall FIX::ThreadedSocketAcceptor::onStop(ThreadedSocketAcceptor *this)

{
  bool bVar1;
  time_t tVar2;
  pointer ppVar3;
  _Self local_90;
  _Base_ptr local_88;
  _Self local_80;
  _Base_ptr local_78;
  time_t local_70;
  time_t now;
  time_t start;
  Locker local_50;
  Locker l;
  iterator i;
  SocketToThread threads;
  ThreadedSocketAcceptor *this_local;
  
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  map((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
       *)&i);
  std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_> *)&l);
  Locker::Locker(&local_50,&this->m_mutex);
  now = 0;
  local_70 = 0;
  time(&now);
  do {
    bVar1 = Acceptor::isLoggedOn(&this->super_Acceptor);
    if (!bVar1) break;
    tVar2 = time(&local_70);
  } while (tVar2 + -5 < now);
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  operator=((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             *)&i,&this->m_threads);
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  clear(&this->m_threads);
  Locker::~Locker(&local_50);
  local_78 = (_Base_ptr)
             std::
             map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::begin((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                      *)&i);
  l.m_mutex = (Mutex *)local_78;
  while( true ) {
    local_80._M_node =
         (_Base_ptr)
         std::
         map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
         ::end((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                *)&i);
    bVar1 = std::operator!=((_Self *)&l,&local_80);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_> *)&l);
    socket_close(ppVar3->first);
    std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_> *)&l);
  }
  local_88 = (_Base_ptr)
             std::
             map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
             ::begin((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                      *)&i);
  l.m_mutex = (Mutex *)local_88;
  while( true ) {
    local_90._M_node =
         (_Base_ptr)
         std::
         map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
         ::end((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                *)&i);
    bVar1 = std::operator!=((_Self *)&l,&local_90);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_> *)&l);
    thread_join(ppVar3->second);
    std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_> *)&l);
  }
  std::
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
  ~map((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
        *)&i);
  return;
}

Assistant:

void ThreadedSocketAcceptor::onStop()
{ 
  SocketToThread threads;
  SocketToThread::iterator i;

  {
    Locker l(m_mutex);

    time_t start = 0;
    time_t now = 0;

    ::time( &start );
    while ( isLoggedOn() )
    {
      if( ::time(&now) -5 >= start )
        break;
    }

    threads = m_threads;
    m_threads.clear();
  }

  for ( i = threads.begin(); i != threads.end(); ++i )
    socket_close( i->first );
  for ( i = threads.begin(); i != threads.end(); ++i )
    thread_join( i->second );
}